

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fossilize.cpp
# Opt level: O1

bool __thiscall
Fossilize::StateReplayer::Impl::parse_fragment_shading_rate_attachment_info
          (Impl *this,Value *state,VkFragmentShadingRateAttachmentInfoKHR **out_info)

{
  bool bVar1;
  Number in_RAX;
  VkFragmentShadingRateAttachmentInfoKHR *pVVar2;
  GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
  *pGVar3;
  Type pGVar4;
  Number NVar5;
  undefined8 local_28;
  
  local_28 = in_RAX;
  pVVar2 = (VkFragmentShadingRateAttachmentInfoKHR *)
           ScratchAllocator::allocate_raw(&this->allocator,0x20,0x10);
  if (pVVar2 != (VkFragmentShadingRateAttachmentInfoKHR *)0x0) {
    pVVar2->pFragmentShadingRateAttachment = (VkAttachmentReference2 *)0x0;
    (pVVar2->shadingRateAttachmentTexelSize).width = 0;
    (pVVar2->shadingRateAttachmentTexelSize).height = 0;
    *(undefined8 *)pVVar2 = 0;
    pVVar2->pNext = (void *)0x0;
  }
  *out_info = pVVar2;
  pGVar3 = (GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
            *)rapidjson::
              GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
              ::operator[]<char_const>
                        ((GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                          *)state,"shadingRateAttachmentTexelSize");
  pGVar4 = rapidjson::
           GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
           ::operator[]<char_const>(pGVar3,"width");
  if ((undefined1  [16])((undefined1  [16])pGVar4->data_ & (undefined1  [16])0x40000000000000) !=
      (undefined1  [16])0x0) {
    (pVVar2->shadingRateAttachmentTexelSize).width = (pGVar4->data_).s.length;
    pGVar3 = (GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
              *)rapidjson::
                GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                ::operator[]<char_const>
                          ((GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                            *)state,"shadingRateAttachmentTexelSize");
    pGVar4 = rapidjson::
             GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
             ::operator[]<char_const>(pGVar3,"height");
    if ((undefined1  [16])((undefined1  [16])pGVar4->data_ & (undefined1  [16])0x40000000000000) !=
        (undefined1  [16])0x0) {
      (pVVar2->shadingRateAttachmentTexelSize).height = (pGVar4->data_).s.length;
      rapidjson::
      GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
      ::FindMember((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                    *)&stack0xffffffffffffffd8,(Ch *)state);
      NVar5.i = (I)rapidjson::
                   GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                   ::MemberEnd(state);
      if (local_28 != NVar5.i64) {
        pGVar4 = rapidjson::
                 GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                 ::operator[]<char_const>
                           ((GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                             *)state,"fragmentShadingRateAttachment");
        bVar1 = parse_attachment2(this,pGVar4,&pVVar2->pFragmentShadingRateAttachment);
        if (!bVar1) {
          return false;
        }
      }
      return true;
    }
  }
  __assert_fail("data_.f.flags & kUintFlag",
                "/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/rapidjson/include/rapidjson/document.h"
                ,0x719,
                "unsigned int rapidjson::GenericValue<rapidjson::UTF8<>>::GetUint() const [Encoding = rapidjson::UTF8<>, Allocator = rapidjson::MemoryPoolAllocator<>]"
               );
}

Assistant:

bool StateReplayer::Impl::parse_fragment_shading_rate_attachment_info(const Value &state,
                                                                      VkFragmentShadingRateAttachmentInfoKHR **out_info)
{
	auto *info = allocator.allocate_cleared<VkFragmentShadingRateAttachmentInfoKHR>();
	*out_info = info;

	info->shadingRateAttachmentTexelSize.width = state["shadingRateAttachmentTexelSize"]["width"].GetUint();
	info->shadingRateAttachmentTexelSize.height = state["shadingRateAttachmentTexelSize"]["height"].GetUint();

	if (state.HasMember("fragmentShadingRateAttachment"))
	{
		if (!parse_attachment2(state["fragmentShadingRateAttachment"], &info->pFragmentShadingRateAttachment))
			return false;
	}

	return true;
}